

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkRef.hpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)14>_> * __thiscall
vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
          (Move<vk::Handle<(vk::HandleType)14>_> *this,Move<vk::Handle<(vk::HandleType)14>_> *other)

{
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> local_38;
  Move<vk::Handle<(vk::HandleType)14>_> *local_18;
  Move<vk::Handle<(vk::HandleType)14>_> *other_local;
  Move<vk::Handle<(vk::HandleType)14>_> *this_local;
  
  if (this != other) {
    local_18 = other;
    other_local = this;
    RefBase<vk::Handle<(vk::HandleType)14>_>::disown
              (&local_38,&other->super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    data.deleter.m_deviceIface = local_38.deleter.m_deviceIface;
    data.object.m_internal = local_38.object.m_internal;
    data.deleter.m_device = local_38.deleter.m_device;
    data.deleter.m_allocator = local_38.deleter.m_allocator;
    RefBase<vk::Handle<(vk::HandleType)14>_>::assign
              (&this->super_RefBase<vk::Handle<(vk::HandleType)14>_>,data);
  }
  return this;
}

Assistant:

inline Move<T>& Move<T>::operator= (Move<T>& other)
{
	if (this != &other)
		this->assign(other.RefBase<T>::disown());

	return *this;
}